

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  iVar1 = test_suite::run((ostream *)&std::cerr,argc,argv);
  return iVar1;
}

Assistant:

int main(int argc, char const* const* argv)
{
#ifdef _MSC_VER
  {
        int flags = _CrtSetDbgFlag(_CRTDBG_REPORT_FLAG);
        flags |= _CRTDBG_LEAK_CHECK_DF;
        _CrtSetDbgFlag(flags);
    }
#endif

  ::test_suite::debug_stream log(std::cerr);
  return ::test_suite::run(log, argc, argv);
}